

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O1

ma_result ma_linear_resampler_get_heap_layout
                    (ma_linear_resampler_config *pConfig,
                    ma_linear_resampler_heap_layout *pHeapLayout)

{
  ma_result mVar1;
  ulong uVar2;
  size_t sVar3;
  ma_lpf_heap_layout heapLayout;
  ma_lpf_config lpfConfig;
  ma_lpf_heap_layout local_40;
  ma_lpf_config local_28;
  
  if (pHeapLayout != (ma_linear_resampler_heap_layout *)0x0) {
    pHeapLayout->x1Offset = 0;
    pHeapLayout->lpfOffset = 0;
    pHeapLayout->sizeInBytes = 0;
    pHeapLayout->x0Offset = 0;
    mVar1 = MA_INVALID_ARGS;
    if ((pConfig != (ma_linear_resampler_config *)0x0) &&
       ((local_28.format = pConfig->format, local_28.format == ma_format_f32 ||
        (local_28.format == ma_format_s16)))) {
      local_28.channels = pConfig->channels;
      uVar2 = (ulong)local_28.channels;
      if (uVar2 != 0) {
        sVar3 = uVar2 << 2;
        if (local_28.format != ma_format_f32) {
          sVar3 = uVar2 * 2;
        }
        pHeapLayout->sizeInBytes = 0;
        pHeapLayout->x0Offset = 0;
        pHeapLayout->x1Offset = sVar3;
        pHeapLayout->sizeInBytes = sVar3 * 2;
        pHeapLayout->lpfOffset = sVar3 * 2 + 7 & 0xfffffffffffffff8;
        local_28.sampleRate = 1;
        local_28._12_4_ = 0;
        local_28.cutoffFrequency = 1.0;
        local_28.order = 8;
        if (pConfig->lpfOrder < 8) {
          local_28.order = pConfig->lpfOrder;
        }
        local_28._28_4_ = 0;
        mVar1 = ma_lpf_get_heap_layout(&local_28,&local_40);
        if (mVar1 == MA_SUCCESS) {
          sVar3 = pHeapLayout->sizeInBytes;
          pHeapLayout->sizeInBytes = sVar3 + local_40.sizeInBytes;
          pHeapLayout->sizeInBytes = local_40.sizeInBytes + sVar3 + 7 & 0xfffffffffffffff8;
          mVar1 = MA_SUCCESS;
        }
      }
    }
    return mVar1;
  }
  __assert_fail("pHeapLayout != ((void*)0)",
                "/workspace/llm4binary/github/license_c_cmakelists/stoneface86[P]trackerboy/vendored/miniaudio/miniaudio.c"
                ,0x966f,
                "ma_result ma_linear_resampler_get_heap_layout(const ma_linear_resampler_config *, ma_linear_resampler_heap_layout *)"
               );
}

Assistant:

static ma_result ma_linear_resampler_get_heap_layout(const ma_linear_resampler_config* pConfig, ma_linear_resampler_heap_layout* pHeapLayout)
{
    MA_ASSERT(pHeapLayout != NULL);

    MA_ZERO_OBJECT(pHeapLayout);

    if (pConfig == NULL) {
        return MA_INVALID_ARGS;
    }

    if (pConfig->format != ma_format_f32 && pConfig->format != ma_format_s16) {
        return MA_INVALID_ARGS;
    }

    if (pConfig->channels == 0) {
        return MA_INVALID_ARGS;
    }

    pHeapLayout->sizeInBytes = 0;

    /* x0 */
    pHeapLayout->x0Offset = pHeapLayout->sizeInBytes;
    if (pConfig->format == ma_format_f32) {
        pHeapLayout->sizeInBytes += sizeof(float) * pConfig->channels;
    } else {
        pHeapLayout->sizeInBytes += sizeof(ma_int16) * pConfig->channels;
    }

    /* x1 */
    pHeapLayout->x1Offset = pHeapLayout->sizeInBytes;
    if (pConfig->format == ma_format_f32) {
        pHeapLayout->sizeInBytes += sizeof(float) * pConfig->channels;
    } else {
        pHeapLayout->sizeInBytes += sizeof(ma_int16) * pConfig->channels;
    }

    /* LPF */
    pHeapLayout->lpfOffset = ma_align_64(pHeapLayout->sizeInBytes);
    {
        ma_result result;
        size_t lpfHeapSizeInBytes;
        ma_lpf_config lpfConfig = ma_lpf_config_init(pConfig->format, pConfig->channels, 1, 1, pConfig->lpfOrder);  /* Sample rate and cutoff frequency do not matter. */

        result = ma_lpf_get_heap_size(&lpfConfig, &lpfHeapSizeInBytes);
        if (result != MA_SUCCESS) {
            return result;
        }

        pHeapLayout->sizeInBytes += lpfHeapSizeInBytes;
    }

    /* Make sure allocation size is aligned. */
    pHeapLayout->sizeInBytes = ma_align_64(pHeapLayout->sizeInBytes);

    return MA_SUCCESS;
}